

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PromiseClient::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,PromiseClient *this
          ,uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint,
          CallHints hints)

{
  ushort uVar1;
  uint64_t uVar2;
  ClientHook *pCVar3;
  Maybe<capnp::MessageSize> local_80;
  CallHints local_52;
  Maybe<capnp::MessageSize> local_50;
  Maybe<capnp::MessageSize> *local_38;
  Maybe<capnp::MessageSize> *sizeHint_local;
  uint64_t uStack_28;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  PromiseClient *this_local;
  Request<capnp::AnyPointer,_capnp::AnyPointer> *pRStack_10;
  CallHints hints_local;
  
  local_38 = sizeHint;
  sizeHint_local._6_2_ = methodId;
  uStack_28 = interfaceId;
  interfaceId_local = (uint64_t)this;
  this_local._6_2_ = hints;
  pRStack_10 = __return_storage_ptr__;
  if ((this->isResolved & 1U) == 0) {
    this->receivedCall = true;
    kj::Maybe<capnp::MessageSize>::Maybe(&local_80,sizeHint);
    RpcClient::newCall(__return_storage_ptr__,&this->super_RpcClient,interfaceId,methodId,&local_80,
                       this_local._6_2_);
    kj::Maybe<capnp::MessageSize>::~Maybe(&local_80);
  }
  else {
    pCVar3 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(&this->cap);
    uVar2 = uStack_28;
    uVar1 = sizeHint_local._6_2_;
    kj::Maybe<capnp::MessageSize>::Maybe(&local_50,sizeHint);
    local_52 = this_local._6_2_;
    (**pCVar3->_vptr_ClientHook)
              (__return_storage_ptr__,pCVar3,uVar2,(ulong)uVar1,&local_50,
               (ulong)(ushort)this_local._6_2_);
    kj::Maybe<capnp::MessageSize>::~Maybe(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

newCall(
        uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint,
        CallHints hints) override {
      if (isResolved) {
        // Go directly to the resolved capability.
        //
        // If we don't do this now, then we'll return an RpcRequest which, as soon as send() is
        // called, may discover that it's not sending to an RPC capability after all, and will
        // just have to call `newCall()` on the inner capability at that point and copy the request
        // over. Better to redirect now and avoid the copy later.
        return cap->newCall(interfaceId, methodId, sizeHint, hints);
      }

      receivedCall = true;

      // IMPORTANT: We must call our superclass's version of newCall(), NOT cap->newCall(), because
      //   the Request object we create needs to check at send() time whether the promise has
      //   resolved and, if so, redirect to the new target.
      return RpcClient::newCall(interfaceId, methodId, sizeHint, hints);
    }